

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::
ContainerEqMatcher<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
::
MatchAndExplain<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
          (ContainerEqMatcher<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
           *this,vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                 *lhs,MatchResultListener *listener)

{
  bool bVar1;
  const_reference __x;
  ostream *os_00;
  reference peVar2;
  ostream *poVar3;
  char *local_c0;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  local_a8;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  local_a0;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  local_98;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  local_90;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  local_88;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  local_80;
  const_iterator it_1;
  const_iterator cStack_70;
  bool printed_header2;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  local_68;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  local_60;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  local_58;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  local_50;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  local_48;
  const_iterator it;
  bool printed_header;
  ostream *os;
  StlContainerReference lhs_stl_container;
  MatchResultListener *listener_local;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *lhs_local;
  ContainerEqMatcher<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  *this_local;
  
  __x = StlContainerView<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
        ::ConstReference(lhs);
  bVar1 = std::operator==(__x,(vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                               *)this);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    os_00 = MatchResultListener::stream(listener);
    if (os_00 != (ostream *)0x0) {
      it._M_current._7_1_ = 0;
      local_48._M_current =
           (external_fixup *)
           std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
           ::begin(__x);
      while( true ) {
        local_50._M_current =
             (external_fixup *)
             std::
             vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
             end(__x);
        bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
        if (!bVar1) break;
        local_60._M_current =
             (external_fixup *)
             std::
             vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
             begin((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    *)this);
        local_68._M_current =
             (external_fixup *)
             std::
             vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
             end((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                  *)this);
        peVar2 = __gnu_cxx::
                 __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
                 ::operator*(&local_48);
        local_58 = ArrayAwareFind<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,pstore::repo::external_fixup>
                             (local_60,local_68,peVar2);
        cStack_70 = std::
                    vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    ::end((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                           *)this);
        bVar1 = __gnu_cxx::operator==(&local_58,&stack0xffffffffffffff90);
        if (bVar1) {
          if ((it._M_current._7_1_ & 1) == 0) {
            std::operator<<(os_00,"which has these unexpected elements: ");
            it._M_current._7_1_ = 1;
          }
          else {
            std::operator<<(os_00,", ");
          }
          peVar2 = __gnu_cxx::
                   __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
                   ::operator*(&local_48);
          UniversalPrint<pstore::repo::external_fixup>(peVar2,os_00);
        }
        __gnu_cxx::
        __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
        ::operator++(&local_48);
      }
      it_1._M_current._7_1_ = 0;
      local_80._M_current =
           (external_fixup *)
           std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
           ::begin((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    *)this);
      while( true ) {
        local_88._M_current =
             (external_fixup *)
             std::
             vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
             end((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                  *)this);
        bVar1 = __gnu_cxx::operator!=(&local_80,&local_88);
        if (!bVar1) break;
        local_98._M_current =
             (external_fixup *)
             std::
             vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
             begin(__x);
        local_a0._M_current =
             (external_fixup *)
             std::
             vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
             end(__x);
        peVar2 = __gnu_cxx::
                 __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
                 ::operator*(&local_80);
        local_90 = ArrayAwareFind<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,pstore::repo::external_fixup>
                             (local_98,local_a0,peVar2);
        local_a8._M_current =
             (external_fixup *)
             std::
             vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
             end(__x);
        bVar1 = __gnu_cxx::operator==(&local_90,&local_a8);
        if (bVar1) {
          if ((it_1._M_current._7_1_ & 1) == 0) {
            if ((it._M_current._7_1_ & 1) == 0) {
              local_c0 = "which";
            }
            else {
              local_c0 = ",\nand";
            }
            poVar3 = std::operator<<(os_00,local_c0);
            std::operator<<(poVar3," doesn\'t have these expected elements: ");
            it_1._M_current._7_1_ = 1;
          }
          else {
            std::operator<<(os_00,", ");
          }
          peVar2 = __gnu_cxx::
                   __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
                   ::operator*(&local_80);
          UniversalPrint<pstore::repo::external_fixup>(peVar2,os_00);
        }
        __gnu_cxx::
        __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
        ::operator++(&local_80);
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }